

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkAbs2(Wlc_Ntk_t *pNtk,Vec_Int_t *vBlacks,Vec_Int_t **pvFlops)

{
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p;
  int *piVar5;
  void *__dest;
  Wlc_Ntk_t *p_00;
  ulong uVar6;
  Wlc_Ntk_t *pWVar7;
  int iVar8;
  Wlc_Obj_t *pWVar9;
  long lVar10;
  long lVar11;
  ushort uVar12;
  int iVar13;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar14;
  ulong uVar15;
  size_t __size;
  long lVar16;
  void *local_48;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  iVar8 = vBlacks->nSize;
  lVar10 = (long)iVar8;
  if (lVar10 == 0) {
    __size = 0;
    __dest = (void *)0x0;
  }
  else {
    __size = lVar10 * 4;
    __dest = malloc(__size);
  }
  memcpy(__dest,vBlacks->pArray,__size);
  uVar2 = pNtk->iObj;
  uVar4 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar4 = uVar2;
  }
  if (uVar4 == 0) {
    local_48 = (void *)0x0;
  }
  else {
    local_48 = malloc((long)(int)uVar4 << 2);
    if (local_48 == (void *)0x0) {
      local_48 = (void *)0x0;
    }
    else {
      memset(local_48,0,(long)(int)uVar2 * 4);
    }
  }
  p_00 = Wlc_NtkDupDfsSimple(pNtk);
  iVar13 = (pNtk->vCis).nSize;
  if (0 < iVar13) {
    lVar11 = 0;
    do {
      iVar3 = (pNtk->vCis).pArray[lVar11];
      if (((long)iVar3 < 1) || (pNtk->nObjsAlloc <= iVar3)) goto LAB_00893bcc;
      if ((undefined1  [24])((undefined1  [24])pNtk->pObjs[iVar3] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        Vec_IntPush(p,iVar3);
        iVar13 = (pNtk->vCis).nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar13);
  }
  if (0 < iVar8) {
    lVar11 = 0;
    do {
      iVar13 = *(int *)((long)__dest + lVar11 * 4);
      if (((long)iVar13 < 1) || (pNtk->nObjsAlloc <= iVar13)) goto LAB_00893bcc;
      if ((pNtk->vCopies).nSize <= iVar13) goto LAB_00893bad;
      *(int *)((long)__dest + lVar11 * 4) = (pNtk->vCopies).pArray[iVar13];
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
    if (0 < iVar8) {
      lVar11 = 0;
      do {
        iVar8 = *(int *)((long)__dest + lVar11 * 4);
        lVar16 = (long)iVar8;
        if ((lVar16 < 1) || (p_00->nObjsAlloc <= iVar8)) goto LAB_00893bcc;
        pWVar9 = p_00->pObjs;
        uVar4 = *(uint *)(pWVar9 + lVar16);
        iVar13 = pWVar9[lVar16].End;
        *(ushort *)(pWVar9 + lVar16) = (ushort)uVar4 | 0x80;
        iVar13 = iVar13 - pWVar9[lVar16].Beg;
        iVar3 = -iVar13;
        if (0 < iVar13) {
          iVar3 = iVar13;
        }
        iVar13 = Wlc_ObjAlloc(p_00,1,uVar4 >> 6 & 1,iVar3,0);
        if ((int)uVar2 <= iVar8) goto LAB_00893beb;
        *(int *)((long)local_48 + lVar16 * 4) = iVar13;
        lVar11 = lVar11 + 1;
      } while (lVar10 != lVar11);
    }
  }
  uVar4 = p_00->nObjsAlloc;
  if ((p_00->vCopies).nCap < (int)uVar4) {
    piVar5 = (p_00->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar4 << 2);
    }
    (p_00->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vCopies).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p_00->vCopies).pArray,0,(ulong)uVar4 * 4);
  }
  (p_00->vCopies).nSize = uVar4;
  if (1 < p_00->iObj) {
    uVar6 = 1;
    do {
      if ((long)p_00->nObjsAlloc <= (long)uVar6) goto LAB_00893bcc;
      if (uVar6 == uVar2) break;
      pWVar9 = p_00->pObjs + uVar6;
      if ((char)*(ushort *)pWVar9 < '\0') {
        *(ushort *)pWVar9 = *(ushort *)pWVar9 & 0xff7f;
        if ((long)(int)uVar2 <= (long)uVar6) goto LAB_00893bad;
        iVar8 = *(int *)((long)local_48 + uVar6 * 4);
      }
      else {
        uVar15 = (ulong)pWVar9->nFanins;
        if (0 < (int)pWVar9->nFanins) {
          paVar1 = &pWVar9->field_10;
          lVar10 = 0;
          do {
            if ((2 < (uint)uVar15) || (paVar14 = paVar1, (*(uint *)pWVar9 & 0x3f | 0x10) == 0x16)) {
              paVar14 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar1->pFanins[0];
            }
            iVar8 = paVar14->Fanins[lVar10];
            if (((long)iVar8 < 0) || ((p_00->vCopies).nSize <= iVar8)) goto LAB_00893bad;
            if ((2 < (uint)uVar15) || (paVar14 = paVar1, (*(uint *)pWVar9 & 0x3f | 0x10) == 0x16)) {
              paVar14 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar1->pFanins[0];
            }
            paVar14->Fanins[lVar10] = (p_00->vCopies).pArray[iVar8];
            lVar10 = lVar10 + 1;
            uVar15 = (ulong)(int)pWVar9->nFanins;
          } while (lVar10 < (long)uVar15);
        }
        iVar8 = (int)uVar6;
      }
      if ((long)(p_00->vCopies).nSize <= (long)uVar6) goto LAB_00893beb;
      (p_00->vCopies).pArray[uVar6] = iVar8;
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)p_00->iObj);
  }
  iVar8 = (p_00->vCos).nSize;
  if (0 < iVar8) {
    piVar5 = (p_00->vCos).pArray;
    lVar10 = 0;
    do {
      uVar2 = piVar5[lVar10];
      lVar11 = (long)(int)uVar2;
      if ((lVar11 < 1) || (p_00->nObjsAlloc <= (int)uVar2)) goto LAB_00893bcc;
      if ((p_00->vCopies).nSize <= (int)uVar2) goto LAB_00893bad;
      uVar4 = (p_00->vCopies).pArray[lVar11];
      if (uVar2 != uVar4) {
        if ((p_00->pObjs[lVar11].field_0x1 & 4) == 0) {
          uVar12 = 0x200;
        }
        else {
          uVar12 = 0x400;
        }
        if ((uint)p_00->nObjsAlloc <= uVar4 || (int)uVar4 < 1) {
LAB_00893bcc:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar9 = p_00->pObjs + uVar4;
        *(ushort *)pWVar9 = *(ushort *)pWVar9 | uVar12;
        if ((p_00->vCopies).nSize <= (int)uVar2) {
LAB_00893bad:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((p_00->vCos).nSize <= lVar10) {
LAB_00893beb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar5 = (p_00->vCos).pArray;
        piVar5[lVar10] = (p_00->vCopies).pArray[lVar11];
        iVar8 = (p_00->vCos).nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar8);
  }
  pWVar7 = Wlc_NtkDupDfsSimple(p_00);
  if (local_48 != (void *)0x0) {
    free(local_48);
  }
  if (__dest != (void *)0x0) {
    free(__dest);
  }
  Wlc_NtkFree(p_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return pWVar7;
}

Assistant:

static Wlc_Ntk_t * Wlc_NtkAbs2( Wlc_Ntk_t * pNtk, Vec_Int_t * vBlacks, Vec_Int_t ** pvFlops )
{
    Vec_Int_t * vFlops  = Vec_IntAlloc( 100 );
    Vec_Int_t * vNodes  = Vec_IntDup( vBlacks );
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    Vec_Int_t * vMapNode2Pi = Vec_IntStart( Wlc_NtkObjNumMax(pNtk) );
    int nOrigObjNum = Wlc_NtkObjNumMax( pNtk );
    Wlc_Ntk_t * p = Wlc_NtkDupDfsSimple( pNtk );

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( !Wlc_ObjIsPi( pObj ) )
            Vec_IntPush( vFlops, Wlc_ObjId( pNtk, pObj ) ); 
    }

    Wlc_NtkForEachObjVec( vNodes, pNtk, pObj, i ) 
        Vec_IntWriteEntry(vNodes, i, Wlc_ObjCopy(pNtk, Wlc_ObjId(pNtk, pObj)));

    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i ) 
    {
        iObj = Wlc_ObjId(p, pObj);
        pObj->Mark = 1;
        // add fresh PI with the same number of bits
        Vec_IntWriteEntry( vMapNode2Pi, iObj, Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 ) );
    }

    Wlc_NtkCleanCopy( p );

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == nOrigObjNum ) 
            break;

        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            iObj = Vec_IntEntry( vMapNode2Pi, i );
        }
        else {
            // update fanins
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }

    Wlc_NtkForEachCo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        if (iObj != Wlc_ObjCopy(p, iObj)) 
        {
            if (pObj->fIsFi)
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsFi = 1;
            else
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsPo = 1;


            Vec_IntWriteEntry(&p->vCos, i, Wlc_ObjCopy(p, iObj));
        }
    }

    pNew = Wlc_NtkDupDfsSimple( p );
    Vec_IntFree( vMapNode2Pi );
    Vec_IntFree( vNodes );
    Wlc_NtkFree( p );

    if ( pvFlops )
        *pvFlops = vFlops;
    else
        Vec_IntFree( vFlops );

    return pNew;
}